

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
slang::IntervalMap<unsigned_long,_std::monostate,_3U>::overlap_iterator::treeFindUnion
          (overlap_iterator *this)

{
  Path *this_00;
  size_type sVar1;
  pointer pEVar2;
  ulong uVar3;
  PointerIntPair<void_*,_6U,_6U,_unsigned_int> PVar4;
  uint uVar5;
  long *plVar6;
  int iVar7;
  long lVar8;
  BranchNode<unsigned_long,_8U,_false> *self;
  ulong uVar9;
  long lVar10;
  uint local_3c;
  NodeRef local_38;
  
  sVar1 = (this->super_iterator).super_const_iterator.path.path.
          super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
  if ((sVar1 != 0) &&
     (pEVar2 = (this->super_iterator).super_const_iterator.path.path.
               super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_,
     pEVar2->offset < pEVar2->size)) {
    this_00 = &(this->super_iterator).super_const_iterator.path;
    iVar7 = (int)sVar1;
    uVar5 = iVar7 - 1;
    PVar4.value = *(ulong *)((long)pEVar2[uVar5].node + (ulong)pEVar2[uVar5].offset * 8);
    iVar7 = ((this->super_iterator).super_const_iterator.map)->height - iVar7;
    if (iVar7 != 0) {
      do {
        uVar9 = PVar4.value & 0xffffffffffffffc0;
        uVar3 = (this->searchKey).left;
        lVar8 = 0x48;
        lVar10 = 0;
        while ((*(ulong *)((uVar9 - 8) + lVar8) < uVar3 && (*(long *)(uVar9 + lVar8) + 1U < uVar3)))
        {
          lVar10 = lVar10 + 1;
          lVar8 = lVar8 + 0x10;
          if ((ulong)((uint)PVar4.value & 0x3f) + 1 == lVar10) goto LAB_003894a3;
        }
        local_3c = (uint)lVar10;
        local_38.pip.value =
             (PointerIntPair<void_*,_6U,_6U,_unsigned_int>)
             (PointerIntPair<void_*,_6U,_6U,_unsigned_int>)PVar4.value;
        SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::
        emplace_back<slang::IntervalMapDetails::NodeRef&,unsigned_int&>
                  ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)this_00,&local_38,
                   &local_3c);
        PVar4.value = *(ulong *)(uVar9 + lVar10 * 8);
        iVar7 = iVar7 + -1;
      } while (iVar7 != 0);
    }
    uVar5 = ((uint)PVar4.value & 0x3f) + 1;
    uVar3 = (this->searchKey).left;
    plVar6 = (long *)(PVar4.value & 0xffffffffffffffc0 | 8);
    uVar9 = 0;
    do {
      if ((uVar3 <= (ulong)plVar6[-1]) || (uVar3 <= *plVar6 + 1U)) {
        if (uVar5 != (uint)uVar9) {
          local_3c = (uint)uVar9;
          local_38.pip.value =
               (PointerIntPair<void_*,_6U,_6U,_unsigned_int>)
               (PointerIntPair<void_*,_6U,_6U,_unsigned_int>)PVar4.value;
          SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::
          emplace_back<slang::IntervalMapDetails::NodeRef&,unsigned_int&>
                    ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)this_00,&local_38,
                     &local_3c);
          return;
        }
        break;
      }
      uVar9 = uVar9 + 1;
      plVar6 = plVar6 + 2;
    } while (uVar5 != uVar9);
LAB_003894a3:
    const_iterator::setRoot
              ((const_iterator *)this,((this->super_iterator).super_const_iterator.map)->rootSize);
  }
  return;
}

Assistant:

[[nodiscard]] constexpr bool empty() const noexcept { return len == 0; }